

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogToFile(int auto_open_depth,char *filename)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  FILE *pFVar4;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == false) {
    if (filename == (char *)0x0) {
      filename = (GImGui->IO).LogFilename;
    }
    if ((filename != (char *)0x0) && (*filename != '\0')) {
      pFVar4 = fopen(filename,"ab");
      pIVar3 = GImGui;
      if (pFVar4 != (FILE *)0x0) {
        pIVar1 = GImGui->CurrentWindow;
        GImGui->LogEnabled = true;
        pIVar3->LogType = ImGuiLogType_File;
        pIVar3->LogNextPrefix = (char *)0x0;
        pIVar3->LogNextSuffix = (char *)0x0;
        pIVar3->LogDepthRef = (pIVar1->DC).TreeDepth;
        if (auto_open_depth < 0) {
          auto_open_depth = pIVar3->LogDepthToExpandDefault;
        }
        pIVar3->LogDepthToExpand = auto_open_depth;
        pIVar3->LogLinePosY = 3.4028235e+38;
        pIVar3->LogLineFirstItem = true;
        pIVar2->LogFile = (ImFileHandle)pFVar4;
      }
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int auto_open_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;

    // FIXME: We could probably open the file in text mode "at", however note that clipboard/buffer logging will still
    // be subject to outputting OS-incompatible carriage return if within strings the user doesn't use IM_NEWLINE.
    // By opening the file in binary mode "ab" we have consistent output everywhere.
    if (!filename)
        filename = g.IO.LogFilename;
    if (!filename || !filename[0])
        return;
    ImFileHandle f = ImFileOpen(filename, "ab");
    if (!f)
    {
        IM_ASSERT(0);
        return;
    }

    LogBegin(ImGuiLogType_File, auto_open_depth);
    g.LogFile = f;
}